

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_strlike(char *zPattern,char *zStr,uint esc)

{
  uint esc_local;
  char *zStr_local;
  char *zPattern_local;
  
  if (zStr == (char *)0x0) {
    zPattern_local._4_4_ = (uint)(zPattern != (char *)0x0);
  }
  else if (zPattern == (char *)0x0) {
    zPattern_local._4_4_ = 1;
  }
  else {
    zPattern_local._4_4_ = patternCompare((u8 *)zPattern,(u8 *)zStr,&likeInfoNorm,esc);
  }
  return zPattern_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_strlike(const char *zPattern, const char *zStr, unsigned int esc){
  if( zStr==0 ){
    return zPattern!=0;
  }else if( zPattern==0 ){
    return 1;
  }else{
    return patternCompare((u8*)zPattern, (u8*)zStr, &likeInfoNorm, esc);
  }
}